

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreDeriveNexts(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  Vec_Int_t *p_00;
  int iVar4;
  uint uVar5;
  int iLit1;
  abctime aVar6;
  Gia_Man_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  uint *puVar10;
  abctime aVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int local_38;
  
  aVar6 = Abc_Clock();
  lVar2 = *(long *)((long)p->ppStas + (ulong)((uint)Sta >> 0x11 & 0x3ff8));
  lVar14 = (long)p->nSize * (ulong)((uint)Sta & 0xfffff);
  if (*(int *)(lVar2 + lVar14 * 4) < 0) {
    return 0;
  }
  pGVar7 = p->pNew;
  if (pGVar7 != (Gia_Man_t *)0x0) {
    if (pGVar7->nObjs < 0xf4241) goto LAB_005cadea;
    Gia_ManStop(pGVar7);
    p->pNew = (Gia_Man_t *)0x0;
  }
  pGVar7 = Gia_ManStart(p->pAig->nObjs * 10);
  p->pNew = pGVar7;
  Gia_ManIncrementTravId(pGVar7);
  Gia_ManHashAlloc(p->pNew);
  pGVar7 = p->pAig;
  pGVar7->pObjs->Value = 0;
  iVar15 = 0;
  while ((iVar15 < pGVar7->vCis->nSize &&
         (pGVar8 = Gia_ManCi(pGVar7,iVar15), pGVar8 != (Gia_Obj_t *)0x0))) {
    pGVar7 = p->pNew;
    uVar12 = pGVar7->nObjs;
    if (uVar12 == pGVar7->nObjsAlloc) {
      uVar1 = uVar12 * 2;
      if (0x1fffffff < (int)(uVar12 * 2)) {
        uVar1 = 0x20000000;
      }
      if (uVar12 == 0x20000000) {
        puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
        exit(1);
      }
      if ((int)uVar1 <= (int)uVar12) {
        __assert_fail("p->nObjs < nObjNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
      }
      if (pGVar7->fVerbose != 0) {
        printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar12,(ulong)uVar1);
        uVar12 = pGVar7->nObjsAlloc;
      }
      if ((int)uVar12 < 1) {
        __assert_fail("p->nObjsAlloc > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
      }
      lVar13 = (long)(int)uVar1;
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) {
        pGVar9 = (Gia_Obj_t *)malloc(lVar13 * 0xc);
      }
      else {
        pGVar9 = (Gia_Obj_t *)realloc(pGVar7->pObjs,lVar13 * 0xc);
        uVar12 = pGVar7->nObjsAlloc;
      }
      pGVar7->pObjs = pGVar9;
      memset(pGVar9 + (int)uVar12,0,(long)(int)(uVar1 - uVar12) * 0xc);
      if (pGVar7->pMuxes != (uint *)0x0) {
        puVar10 = (uint *)realloc(pGVar7->pMuxes,lVar13 * 4);
        pGVar7->pMuxes = puVar10;
        memset(puVar10 + pGVar7->nObjsAlloc,0,(lVar13 - pGVar7->nObjsAlloc) * 4);
      }
      pGVar7->nObjsAlloc = uVar1;
    }
    if ((pGVar7->vHTable).nSize != 0) {
      Vec_IntPush(&pGVar7->vHash,0);
    }
    iVar4 = pGVar7->nObjs;
    pGVar7->nObjs = iVar4 + 1;
    pGVar9 = Gia_ManObj(pGVar7,iVar4);
    uVar3 = *(ulong *)pGVar9;
    *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
    *(ulong *)pGVar9 =
         uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pGVar7->vCis->nSize & 0x1fffffff) << 0x20
    ;
    p_00 = pGVar7->vCis;
    iVar4 = Gia_ObjId(pGVar7,pGVar9);
    Vec_IntPush(p_00,iVar4);
    iVar4 = Gia_ObjId(pGVar7,pGVar9);
    pGVar8->Value = iVar4 * 2;
    iVar15 = iVar15 + 1;
    pGVar7 = p->pAig;
  }
LAB_005cadea:
  uVar12 = 0;
  iVar15 = 0;
  while( true ) {
    pGVar7 = p->pAig;
    if ((pGVar7->nRegs <= iVar15) ||
       (pGVar8 = Gia_ManCi(pGVar7,(pGVar7->vCis->nSize - pGVar7->nRegs) + iVar15),
       pGVar8 == (Gia_Obj_t *)0x0)) break;
    uVar1 = *(uint *)(lVar2 + lVar14 * 4 + 8 + (long)((int)uVar12 >> 5) * 4);
    uVar5 = 0;
    if (((uVar1 >> (uVar12 & 0x1e) & 1) == 0) &&
       (uVar5 = 1, (uVar1 >> (sbyte)(uVar12 & 0x1e) & 2) == 0)) {
      pGVar7 = p->pNew;
      iVar4 = Gia_ObjCioId(pGVar8);
      pGVar9 = Gia_ManCi(pGVar7,iVar4);
      iVar4 = Gia_ObjId(pGVar7,pGVar9);
      uVar5 = Abc_Var2Lit(iVar4,0);
    }
    pGVar8->Value = uVar5;
    iVar15 = iVar15 + 1;
    uVar12 = uVar12 + 2;
  }
  iVar15 = 0;
  while ((iVar15 < p->pAig->nObjs &&
         (pGVar8 = Gia_ManObj(p->pAig,iVar15), pGVar8 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      pGVar7 = p->pNew;
      iVar4 = Gia_ObjFanin0Copy(pGVar8);
      iLit1 = Gia_ObjFanin1Copy(pGVar8);
      uVar12 = Gia_ManHashAnd(pGVar7,iVar4,iLit1);
      pGVar8->Value = uVar12;
    }
    iVar15 = iVar15 + 1;
  }
  iVar15 = 0;
  while ((iVar15 < p->pAig->vCos->nSize &&
         (pGVar8 = Gia_ManCo(p->pAig,iVar15), pGVar8 != (Gia_Obj_t *)0x0))) {
    uVar12 = Gia_ObjFanin0Copy(pGVar8);
    pGVar8->Value = uVar12;
    iVar15 = iVar15 + 1;
  }
  p->nRecCalls = 0;
  iVar15 = Gia_ManAreDeriveNexts_rec(p,Sta);
  if (999999 < p->nRecCalls) {
    printf("Exceeded the limit on the number of transitions from a state cube (%d).\n",1000000);
    p->fStopped = 1;
  }
  aVar11 = Abc_Clock();
  local_38 = (int)aVar6;
  p->timeAig = p->timeAig + ((int)aVar11 - local_38);
  return iVar15;
}

Assistant:

int Gia_ManAreDeriveNexts( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_StaAre_t * pSta;
    Gia_Obj_t * pObj;
    int i, RetValue;
    abctime clk = Abc_Clock();
    pSta = Gia_ManAreSta( p, Sta );
    if ( Gia_StaIsUnused(pSta) )
        return 0;
    // recycle the manager
    if ( p->pNew && Gia_ManObjNum(p->pNew) > 1000000 )
    {
        Gia_ManStop( p->pNew );
        p->pNew = NULL;
    }
    // allocate the manager
    if ( p->pNew == NULL )
    {
        p->pNew = Gia_ManStart( 10 * Gia_ManObjNum(p->pAig) );
        Gia_ManIncrementTravId( p->pNew );
        Gia_ManHashAlloc( p->pNew );
        Gia_ManConst0(p->pAig)->Value = 0;
        Gia_ManForEachCi( p->pAig, pObj, i )
            pObj->Value = Gia_ManAppendCi(p->pNew);
    }
    Gia_ManForEachRo( p->pAig, pObj, i )
    {
        if ( Gia_StaHasValue0( pSta, i ) )
            pObj->Value = 0;
        else if ( Gia_StaHasValue1( pSta, i ) )
            pObj->Value = 1;
        else // don't-care literal
            pObj->Value = Abc_Var2Lit( Gia_ObjId( p->pNew, Gia_ManCi(p->pNew, Gia_ObjCioId(pObj)) ), 0 );
    }
    Gia_ManForEachAnd( p->pAig, pObj, i )
        pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p->pAig, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);

    // perform case-splitting
    p->nRecCalls = 0;
    RetValue = Gia_ManAreDeriveNexts_rec( p, Sta );
    if ( p->nRecCalls >= MAX_CALL_NUM )
    {
        printf( "Exceeded the limit on the number of transitions from a state cube (%d).\n", MAX_CALL_NUM );
        p->fStopped = 1;
    }
//    printf( "%d ", p->nRecCalls );
//printf( "%d ", Gia_ManObjNum(p->pNew) );
    p->timeAig += Abc_Clock() - clk;
    return RetValue;
}